

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::DoCopy
          (TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *this,
          TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  WeaponInfo *pWVar5;
  long lVar6;
  uint i;
  ulong uVar7;
  
  uVar3 = other->Count;
  this->Count = uVar3;
  this->Most = uVar3;
  if ((ulong)uVar3 == 0) {
    this->Array = (WeaponInfo *)0x0;
  }
  else {
    pWVar5 = (WeaponInfo *)
             M_Malloc_Dbg((ulong)uVar3 << 4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                          ,0x199);
    this->Array = pWVar5;
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < this->Count; uVar7 = uVar7 + 1) {
      puVar1 = (undefined8 *)((long)&other->Array->Type + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&this->Array->Type + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}